

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStreamPushNode(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlChar *val_00;
  xmlChar *val_01;
  uint local_4c;
  int n_nodeType;
  int nodeType;
  int n_ns;
  xmlChar *ns;
  int n_name;
  xmlChar *name;
  int n_stream;
  xmlStreamCtxtPtr stream;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 1; name._4_4_ = name._4_4_ + 1) {
    for (ns._4_4_ = 0; (int)ns._4_4_ < 5; ns._4_4_ = ns._4_4_ + 1) {
      for (n_nodeType = 0; n_nodeType < 5; n_nodeType = n_nodeType + 1) {
        for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val_00 = gen_const_xmlChar_ptr(ns._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(n_nodeType,2);
          iVar2 = gen_int(local_4c,3);
          val = xmlStreamPushNode(0,val_00,val_01,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(ns._4_4_,val_00,1);
          des_const_xmlChar_ptr(n_nodeType,val_01,2);
          des_int(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStreamPushNode",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)ns._4_4_);
            printf(" %d",(ulong)(uint)n_nodeType);
            printf(" %d",(ulong)local_4c);
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlStreamPushNode(void) {
    int test_ret = 0;

#if defined(LIBXML_PATTERN_ENABLED)
    int mem_base;
    int ret_val;
    xmlStreamCtxtPtr stream; /* the stream context */
    int n_stream;
    xmlChar * name; /* the current name */
    int n_name;
    xmlChar * ns; /* the namespace name */
    int n_ns;
    int nodeType; /* the type of the node being pushed */
    int n_nodeType;

    for (n_stream = 0;n_stream < gen_nb_xmlStreamCtxtPtr;n_stream++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_ns = 0;n_ns < gen_nb_const_xmlChar_ptr;n_ns++) {
    for (n_nodeType = 0;n_nodeType < gen_nb_int;n_nodeType++) {
        mem_base = xmlMemBlocks();
        stream = gen_xmlStreamCtxtPtr(n_stream, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        ns = gen_const_xmlChar_ptr(n_ns, 2);
        nodeType = gen_int(n_nodeType, 3);

        ret_val = xmlStreamPushNode(stream, (const xmlChar *)name, (const xmlChar *)ns, nodeType);
        desret_int(ret_val);
        call_tests++;
        des_xmlStreamCtxtPtr(n_stream, stream, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        des_const_xmlChar_ptr(n_ns, (const xmlChar *)ns, 2);
        des_int(n_nodeType, nodeType, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStreamPushNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_stream);
            printf(" %d", n_name);
            printf(" %d", n_ns);
            printf(" %d", n_nodeType);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}